

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

void soul::Optimisations::makeFunctionCallInline
               (Program *program,Function *parentFunction,size_t blockIndex,FunctionCall *call)

{
  FunctionCall *fc;
  FunctionCall *block;
  size_t parentFn;
  bool bVar1;
  reference this;
  Block *pBVar2;
  Function *f;
  Module *m;
  Function *pFVar3;
  Inliner local_110;
  FunctionCall *local_30;
  FunctionCall *local_28;
  FunctionCall *call_local;
  size_t blockIndex_local;
  Function *parentFunction_local;
  Program *program_local;
  
  local_28 = call;
  call_local = (FunctionCall *)blockIndex;
  blockIndex_local = (size_t)parentFunction;
  parentFunction_local = (Function *)program;
  bVar1 = heart::Utilities::canFunctionBeInlined(program,parentFunction,call);
  checkAssertion(bVar1,"heart::Utilities::canFunctionBeInlined (program, parentFunction, call)",
                 "makeFunctionCallInline",0xdf);
  this = std::
         vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
         ::operator[]((vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                       *)(blockIndex_local + 0x70),(size_type)call_local);
  pBVar2 = pool_ref<soul::heart::Block>::operator->(this);
  local_30 = local_28;
  bVar1 = contains<soul::LinkedList<soul::heart::Statement>,soul::heart::FunctionCall*>
                    (&pBVar2->statements,&local_30);
  checkAssertion(bVar1,
                 "contains (parentFunction.blocks[blockIndex]->statements, std::addressof (call))",
                 "makeFunctionCallInline",0xe0);
  pFVar3 = parentFunction_local;
  f = heart::FunctionCall::getFunction(local_28);
  m = Program::getModuleContainingFunction((Program *)pFVar3,f);
  parentFn = blockIndex_local;
  block = call_local;
  fc = local_28;
  pFVar3 = heart::FunctionCall::getFunction(local_28);
  Inliner::Inliner(&local_110,m,(Function *)parentFn,(size_t)block,fc,pFVar3);
  Inliner::perform(&local_110);
  Inliner::~Inliner(&local_110);
  return;
}

Assistant:

static void makeFunctionCallInline (Program& program, heart::Function& parentFunction,
                                        size_t blockIndex, heart::FunctionCall& call)
    {
        SOUL_ASSERT (heart::Utilities::canFunctionBeInlined (program, parentFunction, call));
        SOUL_ASSERT (contains (parentFunction.blocks[blockIndex]->statements, std::addressof (call)));

        Inliner (program.getModuleContainingFunction (call.getFunction()),
                 parentFunction, blockIndex, call, call.getFunction()).perform();
    }